

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uptime.cpp
# Opt level: O3

void pstore::broker::uptime(not_null<std::atomic<bool>_*> done)

{
  undefined8 *puVar1;
  not_null<const_char_*> nVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  ostream *poVar8;
  ulong uVar9;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination;
  undefined8 *puVar10;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination_1;
  long *plVar11;
  long *in_FS_OFFSET;
  ostringstream os;
  value_type local_200;
  string local_1e0;
  long *local_1c0;
  not_null<const_char_*> local_1b8;
  not_null<const_char_*> local_1b0;
  timespec local_1a8 [7];
  ios_base local_138 [264];
  
  local_1b0.ptr_ = "uptime 1 second tick starting";
  pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_1b0);
  nVar2.ptr_ = local_1b0.ptr_;
  pstore::details::log_destinations::__tls_init();
  lVar5 = *in_FS_OFFSET;
  if (*(long *)(lVar5 + -8) != 0) {
    pstore::details::log_destinations::__tls_init();
    puVar10 = *(undefined8 **)(lVar5 + -8);
    puVar1 = (undefined8 *)puVar10[1];
    for (puVar10 = (undefined8 *)*puVar10; puVar10 != puVar1; puVar10 = puVar10 + 1) {
      (**(code **)(*(long *)*puVar10 + 0x48))((long *)*puVar10,6,nVar2.ptr_);
    }
  }
  lVar5 = std::chrono::_V2::system_clock::now();
  if ((((done.ptr_)->_M_base)._M_i & 1U) == 0) {
    local_1c0 = (long *)(uptime_channel + 0x40);
    do {
      lVar5 = lVar5 + 1000000000;
LAB_0011ff79:
      lVar6 = std::chrono::_V2::system_clock::now();
      if (lVar6 < lVar5) {
        uVar9 = lVar5 - lVar6;
        if (uVar9 != 0 && lVar6 <= lVar5) {
          local_1a8[0].tv_sec = uVar9 / 1000000000;
          local_1a8[0].tv_nsec = uVar9 % 1000000000;
          do {
            iVar4 = nanosleep(local_1a8,local_1a8);
            if (iVar4 != -1) break;
            piVar7 = __errno_location();
          } while (*piVar7 == 4);
        }
        goto LAB_0011ff79;
      }
      bVar3 = brokerface::channel<pstore::descriptor_condition_variable>::have_listeners
                        ((channel<pstore::descriptor_condition_variable> *)uptime_channel);
      if (bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"{ \"uptime\": ",0xc);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," }",2);
        std::__cxx11::stringbuf::str();
        bVar3 = json::is_valid(&local_1e0);
        if (!bVar3) {
          assert_failed("json::is_valid (str)",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/broker/uptime.cpp"
                        ,0x2d);
        }
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_200,local_1e0._M_dataplus._M_p,
                   local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        iVar4 = pthread_mutex_lock((pthread_mutex_t *)uptime_channel);
        plVar11 = local_1c0;
        if (iVar4 != 0) {
          std::__throw_system_error(iVar4);
        }
        while (plVar11 = (long *)*plVar11, plVar11 != (long *)0x0) {
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)plVar11[1],&local_200);
        }
        descriptor_condition_variable::notify_all
                  ((descriptor_condition_variable *)uptime_channel._40_8_);
        pthread_mutex_unlock((pthread_mutex_t *)uptime_channel);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
      }
    } while ((((done.ptr_)->_M_base)._M_i & 1U) == 0);
  }
  local_1b8.ptr_ = "uptime thread exiting";
  pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_1b8);
  nVar2.ptr_ = local_1b8.ptr_;
  pstore::details::log_destinations::__tls_init();
  lVar5 = *in_FS_OFFSET;
  if (*(long *)(lVar5 + -8) != 0) {
    pstore::details::log_destinations::__tls_init();
    puVar10 = *(undefined8 **)(lVar5 + -8);
    puVar1 = (undefined8 *)puVar10[1];
    for (puVar10 = (undefined8 *)*puVar10; puVar10 != puVar1; puVar10 = puVar10 + 1) {
      (**(code **)(*(long *)*puVar10 + 0x48))((long *)*puVar10,6,nVar2.ptr_);
    }
  }
  return;
}

Assistant:

void uptime (gsl::not_null<std::atomic<bool> *> const done) {
            log (logger::priority::info, "uptime 1 second tick starting");

            auto seconds = std::uint64_t{0};
            auto until = std::chrono::system_clock::now ();
            while (!*done) {
                until += std::chrono::seconds{1};
                std::this_thread::sleep_until (until);
                ++seconds;

                uptime_channel.publish ([seconds] () {
                    std::ostringstream os;
                    os << "{ \"uptime\": " << seconds << " }";
                    std::string const & str = os.str ();
                    PSTORE_ASSERT (json::is_valid (str));
                    return str;
                });
            }

            log (logger::priority::info, "uptime thread exiting");
        }